

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_qdxt1.cpp
# Opt level: O1

void __thiscall crnlib::qdxt1::pack_endpoints_task(qdxt1 *this,uint64 data,void *param_2)

{
  uint *puVar1;
  uint uVar2;
  vector<unsigned_int> *pvVar3;
  raw_node *prVar4;
  dxt_pixel_block *pdVar5;
  dxt1_block *pdVar6;
  uint uVar7;
  ulong uVar8;
  bool bVar9;
  bool bVar10;
  int iVar11;
  uint uVar12;
  crn_thread_id_t cVar13;
  uchar *puVar14;
  uint uVar15;
  color_quad<unsigned_char,_int> *pcVar16;
  ulong uVar17;
  int iVar18;
  uint uVar19;
  cluster_id *pcVar20;
  int i;
  spinlock *this_00;
  long lVar21;
  uint uVar22;
  int iVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  cluster_id cid;
  uint high_color;
  uint low_color;
  color_quad_u8 block_colors [4];
  vector<unsigned_char> selectors;
  vector<crnlib::color_quad<unsigned_char,_int>_> cluster_pixels;
  params p;
  results r;
  dxt1_endpoint_optimizer optimizer;
  uint local_b0c;
  cluster_id local_b08;
  uint local_af0;
  uint local_aec;
  insert_result local_ae8;
  hash_map<crnlib::qdxt1::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt1::cluster_id>,_crnlib::equal_to<crnlib::qdxt1::cluster_id>_>
  *local_ac8;
  uint local_abc;
  uint local_ab8;
  uint local_ab4;
  uint local_ab0;
  uint local_aac;
  uint local_aa8;
  uint local_aa4;
  uint local_aa0;
  uint local_a9c;
  vector<unsigned_char> local_a98;
  vector<crnlib::color_quad<unsigned_char,_int>_> local_a88;
  spinlock *local_a70;
  ulong local_a68;
  qdxt1 *local_a60;
  uint local_a54;
  uint local_a50;
  int local_a4c;
  uint local_a48;
  uint local_a44;
  params local_a40;
  uint64 local_a18;
  ulong local_a10;
  ulong local_a08;
  ulong local_a00;
  dxt1_block *local_9f8;
  results local_9f0;
  dxt1_endpoint_optimizer local_9d0;
  
  local_a88.m_p = (color_quad_u8 *)0x0;
  local_a88.m_size = 0;
  local_a88.m_capacity = 0;
  local_a18 = data;
  vector<crnlib::color_quad<unsigned_char,_int>_>::reserve(&local_a88,0x400);
  local_a98.m_p = (uint8 *)0x0;
  local_a98.m_size = 0;
  local_a98.m_capacity = 0;
  vector<unsigned_char>::reserve(&local_a98,0x400);
  dxt1_endpoint_optimizer::dxt1_endpoint_optimizer(&local_9d0);
  local_a40.m_block_index = 0;
  local_a40.m_pPixels = (color_quad_u8 *)0x0;
  local_a40.m_endpoint_caching = true;
  local_a40.m_use_transparent_indices_for_black = false;
  local_a40.m_force_alpha_blocks = false;
  local_9f0.m_pSelectors = (uint8 *)0x0;
  local_a40._28_4_ = 0x10100;
  local_a40.m_quality = (this->m_params).m_dxt_quality;
  local_a40.m_use_alpha_blocks = (this->m_params).m_use_alpha_blocks;
  local_a40._16_8_ = (ulong)(this->m_params).m_dxt1a_alpha_threshold << 0x20;
  local_a40.m_perceptual = (this->m_params).m_perceptual;
  local_a40.m_grayscale_sampling = false;
  uVar15 = (this->m_endpoint_cluster_indices).m_size / 100 - 1;
  uVar15 = uVar15 >> 0x10 | uVar15;
  uVar15 = uVar15 >> 8 | uVar15;
  uVar15 = uVar15 >> 4 | uVar15;
  uVar15 = uVar15 >> 2 | uVar15;
  uVar15 = (uVar15 >> 1 | uVar15) + 1 >> 1;
  local_abc = 8;
  if (8 < uVar15) {
    local_abc = uVar15;
  }
  local_b08.m_hash = 0;
  local_b08.m_cells.m_p = (uint *)0x0;
  local_b08.m_cells.m_size = 0;
  local_b08.m_cells.m_capacity = 0;
  if ((this->m_endpoint_cluster_indices).m_size != 0) {
    local_abc = local_abc - 1;
    this_00 = &this->m_cluster_hash_lock;
    local_ac8 = &this->m_cluster_hash;
    uVar17 = 0;
    local_a70 = this_00;
    local_a60 = this;
    do {
      if ((this->m_canceled != false) ||
         ((((local_abc & (uint)uVar17) == 0 &&
           (cVar13 = crn_get_current_thread_id(), cVar13 == this->m_main_thread_id)) &&
          (bVar9 = update_progress(this,(uint)uVar17,(this->m_endpoint_cluster_indices).m_size - 1),
          !bVar9)))) break;
      uVar26 = this->m_pTask_pool->m_num_threads;
      if ((uVar26 == 0) || ((int)((uVar17 & 0xffffffff) % (ulong)(uVar26 + 1)) == (int)local_a18)) {
        pvVar3 = (this->m_endpoint_cluster_indices).m_p;
        uVar15 = pvVar3[uVar17].m_size * 0x10;
        local_a68 = uVar17;
        if (local_a98.m_size != uVar15) {
          if (local_a98.m_size <= uVar15) {
            if (local_a98.m_capacity < uVar15) {
              elemental_vector::increase_capacity
                        ((elemental_vector *)&local_a98,uVar15,local_a98.m_size + 1 == uVar15,1,
                         (object_mover)0x0,false);
            }
            memset(local_a98.m_p + (local_a98._8_8_ & 0xffffffff),0,
                   (ulong)(uVar15 - local_a98.m_size));
          }
          local_a98.m_size = uVar15;
        }
        cluster_id::set(&local_b08,pvVar3 + uVar17);
        spinlock::lock(this_00);
        if ((this->m_cluster_hash).m_num_valid == 0) {
LAB_00137ed8:
          uVar26 = (this->m_cluster_hash).m_values.m_size;
        }
        else {
          uVar15 = (uint)((int)local_b08.m_hash * -0x61c88647) >>
                   ((byte)(this->m_cluster_hash).m_hash_shift & 0x1f);
          prVar4 = (this->m_cluster_hash).m_values.m_p;
          bVar9 = true;
          uVar26 = uVar15;
          if (prVar4[uVar15].m_bits[0x1c] != '\0') {
            pcVar20 = (cluster_id *)(prVar4 + uVar15);
            bVar10 = cluster_id::operator==(pcVar20,&local_b08);
            if (bVar10) {
              bVar9 = false;
            }
            else {
              uVar17 = (ulong)uVar15;
              do {
                if ((int)uVar17 == 0) {
                  uVar17 = (ulong)((local_a60->m_cluster_hash).m_values.m_size - 1);
                  pcVar20 = (cluster_id *)((local_a60->m_cluster_hash).m_values.m_p + uVar17);
                }
                else {
                  uVar17 = (ulong)((int)uVar17 - 1);
                  pcVar20 = (cluster_id *)&pcVar20[-2].m_hash;
                }
                uVar26 = (uint)uVar17;
                if ((uVar26 == uVar15) || (*(char *)((long)&pcVar20[1].m_cells.m_p + 4) == '\0'))
                goto LAB_00137ec3;
                bVar10 = cluster_id::operator==(pcVar20,&local_b08);
              } while (!bVar10);
              bVar9 = false;
            }
          }
LAB_00137ec3:
          this_00 = local_a70;
          this = local_a60;
          if (bVar9) goto LAB_00137ed8;
        }
        uVar2 = (this->m_cluster_hash).m_values.m_size;
        local_b0c = 0;
        if (uVar26 != uVar2) {
          local_b0c = *(uint *)((local_ac8->m_values).m_p[uVar26].m_bits + 0x18);
        }
        spinlock::unlock(this_00);
        if (uVar26 == uVar2) {
          uVar15 = local_b08.m_cells.m_size << 4;
          if (local_a88.m_size != uVar15) {
            if ((local_a88.m_size <= uVar15) && (local_a88.m_capacity < uVar15)) {
              elemental_vector::increase_capacity
                        ((elemental_vector *)&local_a88,uVar15,local_a88.m_size + 1 == uVar15,4,
                         (object_mover)0x0,false);
            }
            local_a88.m_size = uVar15;
          }
          if (local_b08.m_cells.m_size == 0) {
            bVar9 = false;
          }
          else {
            uVar17 = 0;
            bVar9 = false;
            pcVar16 = local_a88.m_p;
            do {
              uVar15 = local_b08.m_cells.m_p[uVar17];
              pdVar5 = this->m_pBlocks;
              lVar21 = 0;
              do {
                if ((uint)pdVar5[uVar15].m_pixels[0][0].field_0.c[lVar21 + 3] <
                    (this->m_params).m_dxt1a_alpha_threshold) {
                  bVar9 = true;
                }
                (pcVar16->field_0).c[lVar21] = pdVar5[uVar15].m_pixels[0][0].field_0.c[lVar21];
                (pcVar16->field_0).c[lVar21 + 1] =
                     pdVar5[uVar15].m_pixels[0][0].field_0.c[lVar21 + 1];
                (pcVar16->field_0).c[lVar21 + 2] =
                     pdVar5[uVar15].m_pixels[0][0].field_0.c[lVar21 + 2];
                (pcVar16->field_0).c[lVar21 + 3] =
                     pdVar5[uVar15].m_pixels[0][0].field_0.c[lVar21 + 3];
                lVar21 = lVar21 + 4;
              } while (lVar21 != 0x40);
              uVar17 = uVar17 + 1;
              pcVar16 = pcVar16 + 0x10;
            } while (uVar17 < (local_b08.m_cells._8_8_ & 0xffffffff));
          }
          local_a40.m_block_index = (uint)local_a68;
          local_a40.m_num_pixels = local_a88.m_size;
          local_a40.m_pPixels = local_a88.m_p;
          local_9f0.m_pSelectors = local_a98.m_p;
          if (((this->m_params).m_dxt_quality != cCRNDXTQualitySuperFast) || (bVar9)) {
            local_a40.m_pixels_have_alpha = bVar9;
            dxt1_endpoint_optimizer::compute(&local_9d0,&local_a40,&local_9f0);
            local_aec = (uint)local_9f0.m_low_color;
            local_af0 = (uint)local_9f0.m_high_color;
          }
          else {
            dxt_fast::compress_color_block
                      (local_a88.m_size,local_a88.m_p,&local_aec,&local_af0,local_a98.m_p,true);
          }
          if (local_b08.m_cells.m_size != 0) {
            uVar17 = 0;
            puVar14 = local_a98.m_p;
            do {
              pdVar6 = this->m_pDst_elements;
              uVar15 = this->m_elements_per_block * local_b08.m_cells.m_p[uVar17];
              *(undefined2 *)pdVar6[uVar15].m_low_color = (undefined2)local_aec;
              *(undefined2 *)pdVar6[uVar15].m_high_color = (undefined2)local_af0;
              uVar22 = 0;
              lVar21 = 0x10;
              do {
                uVar19 = uVar22 << 2;
                uVar22 = puVar14[lVar21 + -1] | uVar19;
                lVar21 = lVar21 + -1;
              } while (lVar21 != 0);
              puVar14 = puVar14 + 0x10;
              pdVar6[uVar15].m_selectors[0] = (uint8)uVar22;
              pdVar6[uVar15].m_selectors[1] = (uint8)(uVar19 >> 8);
              pdVar6[uVar15].m_selectors[2] = (uint8)(uVar19 >> 0x10);
              pdVar6[uVar15].m_selectors[3] = (uint8)(uVar19 >> 0x18);
              uVar17 = uVar17 + 1;
            } while (uVar17 < (local_b08.m_cells._8_8_ & 0xffffffff));
          }
          spinlock::lock(this_00);
          local_a9c = local_af0 << 0x10 | local_aec;
          local_ae8.first.m_pTable =
               (hash_map<crnlib::qdxt1::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt1::cluster_id>,_crnlib::equal_to<crnlib::qdxt1::cluster_id>_>
                *)0x0;
          local_ae8.first.m_index = 0;
          local_ae8.second = false;
          if ((this->m_cluster_hash).m_values.m_size == 0) {
LAB_001385b8:
            uVar26 = (this->m_cluster_hash).m_values.m_size * 2;
            if (uVar26 < 5) {
              uVar26 = 4;
            }
            hash_map<crnlib::qdxt1::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt1::cluster_id>,_crnlib::equal_to<crnlib::qdxt1::cluster_id>_>
            ::rehash(local_ac8,uVar26);
            bVar9 = hash_map<crnlib::qdxt1::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt1::cluster_id>,_crnlib::equal_to<crnlib::qdxt1::cluster_id>_>
                    ::insert_no_grow(local_ac8,&local_ae8,&local_b08,&local_a9c);
            if (!bVar9) {
              crnlib_fail("\"insert() failed\"",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/crnlib/crn_hash_map.h"
                          ,0x204);
            }
          }
          else {
            uVar15 = (uint)((int)local_b08.m_hash * -0x61c88647) >>
                     ((byte)(this->m_cluster_hash).m_hash_shift & 0x1f);
            uVar17 = (ulong)uVar15;
            prVar4 = (this->m_cluster_hash).m_values.m_p;
            pcVar20 = (cluster_id *)(prVar4 + uVar17);
            if (prVar4[uVar17].m_bits[0x1c] == '\0') {
LAB_00138538:
              if ((this->m_cluster_hash).m_grow_threshold <= (this->m_cluster_hash).m_num_valid)
              goto LAB_001385b8;
              (pcVar20->m_cells).m_p = (uint *)0x0;
              (pcVar20->m_cells).m_size = 0;
              (pcVar20->m_cells).m_capacity = 0;
              elemental_vector::increase_capacity
                        ((elemental_vector *)pcVar20,local_b08.m_cells.m_size,false,4,
                         (object_mover)0x0,false);
              (pcVar20->m_cells).m_size = local_b08.m_cells.m_size;
              memcpy((pcVar20->m_cells).m_p,local_b08.m_cells.m_p,
                     (local_b08.m_cells._8_8_ & 0xffffffff) << 2);
              pcVar20->m_hash = local_b08.m_hash;
              *(uint *)&pcVar20[1].m_cells.m_p = local_a9c;
              *(undefined1 *)((long)&pcVar20[1].m_cells.m_p + 4) = 1;
              puVar1 = &(this->m_cluster_hash).m_num_valid;
              *puVar1 = *puVar1 + 1;
              local_ae8.second = true;
            }
            else {
              bVar9 = cluster_id::operator==(pcVar20,&local_b08);
              if (!bVar9) {
                do {
                  if ((int)uVar17 == 0) {
                    uVar17 = (ulong)((this->m_cluster_hash).m_values.m_size - 1);
                    pcVar20 = (cluster_id *)((this->m_cluster_hash).m_values.m_p + uVar17);
                  }
                  else {
                    uVar17 = (ulong)((int)uVar17 - 1);
                    pcVar20 = (cluster_id *)&pcVar20[-2].m_hash;
                  }
                  uVar22 = (uint)uVar17;
                  bVar9 = uVar15 != uVar22;
                  if (uVar15 == uVar22) {
LAB_00138532:
                    bVar10 = false;
                    goto LAB_00138534;
                  }
                  if (*(char *)((long)&pcVar20[1].m_cells.m_p + 4) == '\0') {
                    bVar9 = true;
                    goto LAB_00138532;
                  }
                  bVar9 = cluster_id::operator==(pcVar20,&local_b08);
                } while (!bVar9);
                local_ae8.first.m_pTable = local_ac8;
                local_ae8.second = false;
                bVar10 = true;
                bVar9 = false;
                local_ae8.first.m_index = uVar22;
LAB_00138534:
                uVar15 = uVar22;
                if (bVar9) goto LAB_00138538;
                if (!bVar10) goto LAB_001385b8;
                goto LAB_0013860b;
              }
              local_ae8.second = false;
            }
            local_ae8.first.m_pTable = local_ac8;
            local_ae8.first.m_index = uVar15;
          }
LAB_0013860b:
          spinlock::unlock(this_00);
          uVar17 = local_a68;
        }
        else {
          local_aa0 = local_b0c >> 0x10;
          dxt1_block::get_block_colors
                    ((color_quad_u8 *)&local_ae8,(uint16)local_b0c,(uint16)(local_b0c >> 0x10));
          this_00 = local_a70;
          uVar17 = local_a68;
          if (local_b08.m_cells.m_size != 0) {
            local_a44 = local_b0c & 0xffff;
            local_a50 = local_b0c >> 8;
            local_a54 = local_b0c >> 0x18;
            uVar8 = 0;
            do {
              local_a10 = uVar8;
              uVar15 = local_b08.m_cells.m_p[local_a10];
              local_a08 = (ulong)uVar15;
              pdVar5 = this->m_pBlocks;
              iVar11 = 0;
              do {
                local_a4c = iVar11;
                local_9f8 = this->m_pDst_elements;
                local_a00 = (ulong)(this->m_elements_per_block * uVar15);
                local_9f8[local_a00].m_low_color[0] = (uint8)local_b0c;
                local_9f8[local_a00].m_low_color[1] = (uint8)(local_b0c >> 8);
                local_9f8[local_a00].m_high_color[0] = (uint8)local_aa0;
                local_9f8[local_a00].m_high_color[1] = (uint8)(local_b0c >> 0x18);
                bVar9 = (this->m_params).m_perceptual;
                local_aa4 = (uint)(byte)local_ae8.first.m_pTable;
                local_aa8 = (uint)local_ae8.first.m_pTable._1_1_;
                local_aac = (uint)local_ae8.first.m_pTable._2_1_;
                local_a48 = (this->m_params).m_dxt1a_alpha_threshold;
                local_ab0 = (uint)(byte)local_ae8.first._12_1_;
                local_ab4 = (uint)(byte)local_ae8.first._13_1_;
                local_ab8 = (uint)(byte)local_ae8.first._14_1_;
                lVar21 = 0xf;
                uVar22 = 0;
                do {
                  uVar19 = (uint)pdVar5[local_a08].m_pixels[0][lVar21].field_0.field_0.r;
                  uVar24 = (uint)pdVar5[local_a08].m_pixels[0][lVar21].field_0.field_0.g;
                  uVar12 = (uint)pdVar5[local_a08].m_pixels[0][lVar21].field_0.field_0.b;
                  if (bVar9 == false) {
                    iVar11 = uVar19 - local_aa4;
                    iVar23 = uVar24 - local_aa8;
                    iVar18 = uVar12 - local_aac;
                    uVar19 = iVar18 * iVar18 + iVar23 * iVar23 + iVar11 * iVar11;
                  }
                  else {
                    iVar11 = uVar19 - local_aa4;
                    iVar23 = uVar24 - local_aa8;
                    iVar18 = uVar12 - local_aac;
                    uVar19 = iVar18 * iVar18 + iVar23 * iVar23 * 0x19 + iVar11 * iVar11 * 8;
                  }
                  iVar18 = (uint)pdVar5[local_a08].m_pixels[0][lVar21].field_0.field_0.r -
                           (uint)local_ae8.first.m_pTable._4_1_;
                  iVar23 = (uint)pdVar5[local_a08].m_pixels[0][lVar21].field_0.field_0.g -
                           (uint)local_ae8.first.m_pTable._5_1_;
                  iVar11 = (uint)pdVar5[local_a08].m_pixels[0][lVar21].field_0.field_0.b -
                           (uint)local_ae8.first.m_pTable._6_1_;
                  iVar18 = iVar18 * iVar18;
                  iVar23 = iVar23 * iVar23;
                  if (bVar9 == false) {
                    uVar12 = iVar11 * iVar11 + iVar23 + iVar18;
                  }
                  else {
                    uVar12 = iVar11 * iVar11 + iVar23 * 0x19 + iVar18 * 8;
                  }
                  iVar23 = (uint)pdVar5[local_a08].m_pixels[0][lVar21].field_0.field_0.r -
                           (local_ae8.first.m_index & 0xff);
                  iVar18 = (uint)pdVar5[local_a08].m_pixels[0][lVar21].field_0.field_0.g -
                           (local_ae8.first.m_index >> 8 & 0xff);
                  iVar11 = (uint)pdVar5[local_a08].m_pixels[0][lVar21].field_0.field_0.b -
                           (local_ae8.first.m_index >> 0x10 & 0xff);
                  iVar23 = iVar23 * iVar23;
                  iVar18 = iVar18 * iVar18;
                  if (bVar9 == false) {
                    uVar24 = iVar11 * iVar11 + iVar18 + iVar23;
                  }
                  else {
                    uVar24 = iVar11 * iVar11 + iVar18 * 0x19 + iVar23 * 8;
                  }
                  uVar7 = uVar19;
                  if (uVar12 < uVar19) {
                    uVar7 = uVar12;
                  }
                  uVar19 = (uint)(uVar12 < uVar19);
                  if (uVar24 < uVar7) {
                    uVar19 = 2;
                    uVar7 = uVar24;
                  }
                  if (local_aa0 < local_a44) {
                    uVar24 = (uint)pdVar5[local_a08].m_pixels[0][lVar21].field_0.field_0.r;
                    uVar25 = (uint)pdVar5[local_a08].m_pixels[0][lVar21].field_0.field_0.g;
                    uVar12 = (uint)pdVar5[local_a08].m_pixels[0][lVar21].field_0.field_0.b;
                    if (bVar9 == false) {
                      iVar18 = uVar24 - local_ab0;
                      iVar23 = uVar25 - local_ab4;
                      iVar11 = uVar12 - local_ab8;
                      uVar12 = iVar11 * iVar11 + iVar23 * iVar23 + iVar18 * iVar18;
                    }
                    else {
                      iVar18 = uVar24 - local_ab0;
                      iVar23 = uVar25 - local_ab4;
                      iVar11 = uVar12 - local_ab8;
                      uVar12 = iVar11 * iVar11 + iVar23 * iVar23 * 0x19 + iVar18 * iVar18 * 8;
                    }
                    bVar10 = uVar12 < uVar7;
                  }
                  else {
                    bVar10 = pdVar5[local_a08].m_pixels[0][lVar21].field_0.field_0.a < local_a48;
                  }
                  uVar12 = 3;
                  if (!bVar10) {
                    uVar12 = uVar19;
                  }
                  uVar19 = uVar22 << 2;
                  uVar22 = uVar12 | uVar19;
                  bVar10 = lVar21 != 0;
                  lVar21 = lVar21 + -1;
                } while (bVar10);
                local_9f8[local_a00].m_selectors[0] = (uint8)uVar22;
                local_9f8[local_a00].m_selectors[1] = (uint8)(uVar19 >> 8);
                local_9f8[local_a00].m_selectors[2] = (uint8)(uVar19 >> 0x10);
                local_9f8[local_a00].m_selectors[3] = (uint8)(uVar19 >> 0x18);
                this = local_a60;
                iVar11 = local_a4c + 1;
              } while (local_a4c + 1 != 0x10);
              uVar8 = local_a10 + 1;
            } while (local_a10 + 1 < (local_b08.m_cells._8_8_ & 0xffffffff));
          }
        }
      }
      uVar17 = uVar17 + 1;
    } while (uVar17 < (this->m_endpoint_cluster_indices).m_size);
  }
  if (local_b08.m_cells.m_p != (uint *)0x0) {
    crnlib_free(local_b08.m_cells.m_p);
  }
  dxt1_endpoint_optimizer::~dxt1_endpoint_optimizer(&local_9d0);
  if (local_a98.m_p != (uint8 *)0x0) {
    crnlib_free(local_a98.m_p);
  }
  if (local_a88.m_p != (color_quad_u8 *)0x0) {
    crnlib_free(local_a88.m_p);
  }
  return;
}

Assistant:

void qdxt1::pack_endpoints_task(uint64 data, void*)
    {
        const uint thread_index = static_cast<uint>(data);

        crnlib::vector<color_quad_u8> cluster_pixels;
        cluster_pixels.reserve(1024);

        crnlib::vector<uint8> selectors;
        selectors.reserve(1024);

        dxt1_endpoint_optimizer optimizer;
        dxt1_endpoint_optimizer::params p;
        dxt1_endpoint_optimizer::results r;

        p.m_quality = m_params.m_dxt_quality;
        p.m_use_alpha_blocks = m_params.m_use_alpha_blocks;
        p.m_dxt1a_alpha_threshold = m_params.m_dxt1a_alpha_threshold;
        p.m_perceptual = m_params.m_perceptual;

        uint cluster_index_progress_mask = math::next_pow2(m_endpoint_cluster_indices.size() / 100);
        cluster_index_progress_mask /= 2;
        cluster_index_progress_mask = math::maximum<uint>(cluster_index_progress_mask, 8);
        cluster_index_progress_mask -= 1;

        cluster_id cid;
        const crnlib::vector<uint32>& indices = cid.m_cells;

        for (uint cluster_index = 0; cluster_index < m_endpoint_cluster_indices.size(); cluster_index++)
        {
            if (m_canceled)
            {
                return;
            }

            if ((cluster_index & cluster_index_progress_mask) == 0)
            {
                if (crn_get_current_thread_id() == m_main_thread_id)
                {
                    if (!update_progress(cluster_index, m_endpoint_cluster_indices.size() - 1))
                    {
                        return;
                    }
                }
            }

            if (m_pTask_pool->get_num_threads())
            {
                if ((cluster_index % (m_pTask_pool->get_num_threads() + 1)) != thread_index)
                {
                    continue;
                }
            }

            const crnlib::vector<uint>& cluster_indices = m_endpoint_cluster_indices[cluster_index];

            selectors.resize(cluster_indices.size() * cDXTBlockSize * cDXTBlockSize);

            bool found = false;
            uint32 found_endpoints = 0;

            cid.set(cluster_indices);

            {
                scoped_spinlock lock(m_cluster_hash_lock);

                cluster_hash::const_iterator it(m_cluster_hash.find(cid));
                if (it != m_cluster_hash.end())
                {
                    CRNLIB_ASSERT(cid == it->first);

                    found = true;
                    found_endpoints = it->second;
                }
            }

            if (found)
            {
                const uint16 low_color = static_cast<uint16>(found_endpoints);
                const uint16 high_color = static_cast<uint16>((found_endpoints >> 16U));

                color_quad_u8 block_colors[4];
                dxt1_block::get_block_colors(block_colors, low_color, high_color);

                const bool is_alpha_block = (low_color <= high_color);

                for (uint block_iter = 0; block_iter < indices.size(); block_iter++)
                {
                    const uint block_index = indices[block_iter];

                    const color_quad_u8* pSrc_pixels = &m_pBlocks[block_index].m_pixels[0][0];

                    for (uint i = 0; i < cDXTBlockSize * cDXTBlockSize; i++)
                    {
                        dxt1_block& dxt_block = get_block(block_index);

                        dxt_block.set_low_color(static_cast<uint16>(low_color));
                        dxt_block.set_high_color(static_cast<uint16>(high_color));

                        uint mask = 0;
                        for (int i = 15; i >= 0; i--)
                        {
                            mask <<= 2;

                            const color_quad_u8& c = pSrc_pixels[i];

                            uint dist0 = color::color_distance(m_params.m_perceptual, c, block_colors[0], false);
                            uint dist1 = color::color_distance(m_params.m_perceptual, c, block_colors[1], false);
                            uint dist2 = color::color_distance(m_params.m_perceptual, c, block_colors[2], false);

                            uint selector = 0, best_dist = dist0;

                            if (dist1 < best_dist)
                            {
                                selector = 1;
                                best_dist = dist1;
                            }
                            if (dist2 < best_dist)
                            {
                                selector = 2;
                                best_dist = dist2;
                            }

                            if (!is_alpha_block)
                            {
                                uint dist3 = color::color_distance(m_params.m_perceptual, c, block_colors[3], false);
                                if (dist3 < best_dist)
                                {
                                    selector = 3;
                                }
                            }
                            else
                            {
                                if (c.a < m_params.m_dxt1a_alpha_threshold)
                                {
                                    selector = 3;
                                }
                            }

                            mask |= selector;
                        }

                        dxt_block.m_selectors[0] = static_cast<uint8>(mask & 0xFF);
                        dxt_block.m_selectors[1] = static_cast<uint8>((mask >> 8) & 0xFF);
                        dxt_block.m_selectors[2] = static_cast<uint8>((mask >> 16) & 0xFF);
                        dxt_block.m_selectors[3] = static_cast<uint8>((mask >> 24) & 0xFF);
                    }
                }
            }
            else
            {
                cluster_pixels.resize(indices.size() * cDXTBlockSize * cDXTBlockSize);

                color_quad_u8* pDst = &cluster_pixels[0];

                bool has_alpha_pixels = false;

                for (uint block_iter = 0; block_iter < indices.size(); block_iter++)
                {
                    const uint block_index = indices[block_iter];

                    //const color_quad_u8* pSrc_pixels = &m_pBlocks[block_index].m_pixels[0][0];
                    const color_quad_u8* pSrc_pixels = (const color_quad_u8*)m_pBlocks[block_index].m_pixels;

                    for (uint i = 0; i < cDXTBlockSize * cDXTBlockSize; i++)
                    {
                        const color_quad_u8& src = pSrc_pixels[i];

                        if (src.a < m_params.m_dxt1a_alpha_threshold)
                        {
                            has_alpha_pixels = true;
                        }

                        *pDst++ = src;
                    }
                }

                p.m_block_index = cluster_index;
                p.m_num_pixels = cluster_pixels.size();
                p.m_pPixels = cluster_pixels.begin();

                r.m_pSelectors = selectors.begin();

                uint low_color, high_color;
                if ((m_params.m_dxt_quality != cCRNDXTQualitySuperFast) || (has_alpha_pixels))
                {
                    p.m_pixels_have_alpha = has_alpha_pixels;

                    optimizer.compute(p, r);
                    low_color = r.m_low_color;
                    high_color = r.m_high_color;
                }
                else
                {
                    dxt_fast::compress_color_block(cluster_pixels.size(), cluster_pixels.begin(), low_color, high_color, selectors.begin(), true);
                }

                const uint8* pSrc_selectors = selectors.begin();

                for (uint block_iter = 0; block_iter < indices.size(); block_iter++)
                {
                    const uint block_index = indices[block_iter];

                    dxt1_block& dxt_block = get_block(block_index);

                    dxt_block.set_low_color(static_cast<uint16>(low_color));
                    dxt_block.set_high_color(static_cast<uint16>(high_color));

                    uint mask = 0;
                    for (int i = 15; i >= 0; i--)
                    {
                        mask <<= 2;
                        mask |= pSrc_selectors[i];
                    }
                    pSrc_selectors += (cDXTBlockSize * cDXTBlockSize);

                    dxt_block.m_selectors[0] = static_cast<uint8>(mask & 0xFF);
                    dxt_block.m_selectors[1] = static_cast<uint8>((mask >> 8) & 0xFF);
                    dxt_block.m_selectors[2] = static_cast<uint8>((mask >> 16) & 0xFF);
                    dxt_block.m_selectors[3] = static_cast<uint8>((mask >> 24) & 0xFF);
                }

                {
                    scoped_spinlock lock(m_cluster_hash_lock);

                    m_cluster_hash.insert(cid, low_color | (high_color << 16));
                }
            }
        }
    }